

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_userid_filter_module.c
# Opt level: O3

ngx_int_t ngx_http_userid_set_variable
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  ngx_http_userid_conf_t *conf;
  ngx_http_userid_ctx_t *ctx;
  ngx_int_t nVar1;
  
  conf = (ngx_http_userid_conf_t *)r->main->loc_conf[ngx_http_userid_filter_module.ctx_index];
  if (1 < conf->enable) {
    ctx = ngx_http_userid_get_uid(r->main,conf);
    if (ctx == (ngx_http_userid_ctx_t *)0x0) {
      return -1;
    }
    nVar1 = ngx_http_userid_create_uid(r->main,ctx,conf);
    if (nVar1 != 0) {
      return -1;
    }
    if (ctx->uid_set[3] != 0) {
      nVar1 = ngx_http_userid_variable(r->main,v,&conf->name,ctx->uid_set);
      return nVar1;
    }
  }
  v->field_0x3 = v->field_0x3 | 0x40;
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_userid_set_variable(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    ngx_http_userid_ctx_t   *ctx;
    ngx_http_userid_conf_t  *conf;

    conf = ngx_http_get_module_loc_conf(r->main, ngx_http_userid_filter_module);

    if (conf->enable < NGX_HTTP_USERID_V1) {
        v->not_found = 1;
        return NGX_OK;
    }

    ctx = ngx_http_userid_get_uid(r->main, conf);

    if (ctx == NULL) {
        return NGX_ERROR;
    }

    if (ngx_http_userid_create_uid(r->main, ctx, conf) != NGX_OK) {
        return NGX_ERROR;
    }

    if (ctx->uid_set[3] == 0) {
        v->not_found = 1;
        return NGX_OK;
    }

    return ngx_http_userid_variable(r->main, v, &conf->name, ctx->uid_set);
}